

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::create_pipeline(ConvolutionDepthWise_x86_avx *this,Option *opt)

{
  long lVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  Layer *pLVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  byte *in_RSI;
  long *in_RDI;
  Mat weight_data_r2_1;
  Mat weight_data_r2;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_00000600;
  ConvolutionDepthWise_x86_avx *in_stack_00000608;
  Option *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  int iVar10;
  void **ppvVar9;
  Mat *in_stack_fffffffffffffde8;
  Mat *dst;
  Mat *in_stack_fffffffffffffdf0;
  int local_1f8;
  void *local_1e8;
  int *local_1e0;
  Allocator *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  Mat *in_stack_fffffffffffffe38;
  Option *in_stack_fffffffffffffe40;
  ConvolutionDepthWise_x86_avx *in_stack_fffffffffffffe48;
  Option *in_stack_fffffffffffffe60;
  Mat *in_stack_fffffffffffffe68;
  undefined4 local_190;
  int in_stack_fffffffffffffe74;
  int *local_188;
  long *local_170;
  int local_144;
  int local_124;
  void *__ptr;
  
  iVar10 = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x160) == 0) {
    pLVar5 = create_activation_layer
                       (in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,
                        in_stack_fffffffffffffe60);
    in_RDI[1] = (long)pLVar5;
    if (((in_RSI[0x1e] & 1) == 0) ||
       (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x178) != 1)) {
      uVar3 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) /
              (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      iVar4 = ((int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                    (long)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8))) /
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108))) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      if ((iVar4 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108)) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) ==
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
        local_144 = 1;
        if ((in_RSI[0x27] & 1) != 0) {
          if (iVar4 % 8 == 0) {
            local_1f8 = 8;
          }
          else {
            local_1f8 = 1;
            if (iVar4 % 4 == 0) {
              local_1f8 = 4;
            }
          }
          local_144 = local_1f8;
        }
        if (local_144 == 8) {
          Mat::reshape(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30
                       ,in_stack_fffffffffffffe28);
          convert_packing(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,iVar10,
                          in_stack_fffffffffffffdd8);
          if (local_188 != (int *)0x0) {
            LOCK();
            iVar4 = *local_188;
            *local_188 = *local_188 + -1;
            UNLOCK();
            if (iVar4 == 1) {
              if (local_170 == (long *)0x0) {
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
              }
              else {
                (**(code **)(*local_170 + 0x18))(local_170,__ptr);
              }
            }
          }
        }
        if (local_144 == 4) {
          dst = (Mat *)&local_1e8;
          Mat::reshape(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30
                       ,in_stack_fffffffffffffe28);
          convert_packing(in_stack_fffffffffffffdf0,dst,iVar10,in_stack_fffffffffffffdd8);
          ppvVar9 = &local_1e8;
          if (local_1e0 != (int *)0x0) {
            LOCK();
            iVar10 = *local_1e0;
            *local_1e0 = *local_1e0 + -1;
            UNLOCK();
            if (iVar10 == 1) {
              if (in_stack_fffffffffffffe38 == (Mat *)0x0) {
                if (local_1e8 != (void *)0x0) {
                  free(local_1e8);
                }
              }
              else {
                (**(code **)((long)in_stack_fffffffffffffe38->data + 0x18))
                          (in_stack_fffffffffffffe38,local_1e8);
              }
            }
          }
          *ppvVar9 = (void *)0x0;
          ppvVar9[2] = (void *)0x0;
          *(undefined4 *)(ppvVar9 + 3) = 0;
          *(undefined4 *)(ppvVar9 + 5) = 0;
          *(undefined4 *)((long)ppvVar9 + 0x2c) = 0;
          *(undefined4 *)(ppvVar9 + 6) = 0;
          *(undefined4 *)((long)ppvVar9 + 0x34) = 0;
          *(undefined4 *)(ppvVar9 + 7) = 0;
          ppvVar9[8] = (void *)0x0;
          ppvVar9[1] = (void *)0x0;
        }
        if (local_144 == 1) {
          if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
             (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            lVar1 = *(long *)(*in_RDI + -0x18);
            plVar6 = (long *)((long)in_RDI + lVar1 + 0x168);
            plVar8 = in_RDI + 5;
            if (plVar8 != plVar6) {
              if (*(long *)((long)in_RDI + lVar1 + 0x170) != 0) {
                piVar2 = *(int **)((long)in_RDI + lVar1 + 0x170);
                LOCK();
                *piVar2 = *piVar2 + 1;
                UNLOCK();
              }
              if (in_RDI[6] != 0) {
                piVar2 = (int *)in_RDI[6];
                LOCK();
                iVar10 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (iVar10 == 1) {
                  if (in_RDI[9] == 0) {
                    if ((void *)*plVar8 != (void *)0x0) {
                      free((void *)*plVar8);
                    }
                  }
                  else {
                    (**(code **)(*(long *)in_RDI[9] + 0x18))((long *)in_RDI[9],*plVar8);
                  }
                }
              }
              *plVar8 = 0;
              in_RDI[7] = 0;
              *(undefined4 *)(in_RDI + 8) = 0;
              *(undefined4 *)(in_RDI + 10) = 0;
              *(undefined4 *)((long)in_RDI + 0x54) = 0;
              *(undefined4 *)(in_RDI + 0xb) = 0;
              *(undefined4 *)((long)in_RDI + 0x5c) = 0;
              *(undefined4 *)(in_RDI + 0xc) = 0;
              in_RDI[0xd] = 0;
              in_RDI[6] = 0;
              *plVar8 = *plVar6;
              in_RDI[6] = *(long *)((long)in_RDI + lVar1 + 0x170);
              in_RDI[7] = *(long *)((long)in_RDI + lVar1 + 0x178);
              *(undefined4 *)(in_RDI + 8) = *(undefined4 *)((long)in_RDI + lVar1 + 0x180);
              in_RDI[9] = *(long *)((long)in_RDI + lVar1 + 0x188);
              *(undefined4 *)(in_RDI + 10) = *(undefined4 *)((long)in_RDI + lVar1 + 400);
              *(undefined4 *)((long)in_RDI + 0x54) = *(undefined4 *)((long)in_RDI + lVar1 + 0x194);
              *(undefined4 *)(in_RDI + 0xb) = *(undefined4 *)((long)in_RDI + lVar1 + 0x198);
              *(undefined4 *)((long)in_RDI + 0x5c) = *(undefined4 *)((long)in_RDI + lVar1 + 0x19c);
              *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)((long)in_RDI + lVar1 + 0x1a0);
              in_RDI[0xd] = *(long *)((long)in_RDI + lVar1 + 0x1a8);
            }
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            lVar1 = *(long *)(*in_RDI + -0x18);
            plVar6 = (long *)((long)in_RDI + lVar1 + 0x168);
            plVar8 = in_RDI + 5;
            if (plVar8 != plVar6) {
              if (*(long *)((long)in_RDI + lVar1 + 0x170) != 0) {
                piVar2 = *(int **)((long)in_RDI + lVar1 + 0x170);
                LOCK();
                *piVar2 = *piVar2 + 1;
                UNLOCK();
              }
              if (in_RDI[6] != 0) {
                piVar2 = (int *)in_RDI[6];
                LOCK();
                iVar10 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (iVar10 == 1) {
                  if (in_RDI[9] == 0) {
                    if ((void *)*plVar8 != (void *)0x0) {
                      free((void *)*plVar8);
                    }
                  }
                  else {
                    (**(code **)(*(long *)in_RDI[9] + 0x18))((long *)in_RDI[9],*plVar8);
                  }
                }
              }
              *plVar8 = 0;
              in_RDI[7] = 0;
              *(undefined4 *)(in_RDI + 8) = 0;
              *(undefined4 *)(in_RDI + 10) = 0;
              *(undefined4 *)((long)in_RDI + 0x54) = 0;
              *(undefined4 *)(in_RDI + 0xb) = 0;
              *(undefined4 *)((long)in_RDI + 0x5c) = 0;
              *(undefined4 *)(in_RDI + 0xc) = 0;
              in_RDI[0xd] = 0;
              in_RDI[6] = 0;
              *plVar8 = *plVar6;
              in_RDI[6] = *(long *)((long)in_RDI + lVar1 + 0x170);
              in_RDI[7] = *(long *)((long)in_RDI + lVar1 + 0x178);
              *(undefined4 *)(in_RDI + 8) = *(undefined4 *)((long)in_RDI + lVar1 + 0x180);
              in_RDI[9] = *(long *)((long)in_RDI + lVar1 + 0x188);
              *(undefined4 *)(in_RDI + 10) = *(undefined4 *)((long)in_RDI + lVar1 + 400);
              *(undefined4 *)((long)in_RDI + 0x54) = *(undefined4 *)((long)in_RDI + lVar1 + 0x194);
              *(undefined4 *)(in_RDI + 0xb) = *(undefined4 *)((long)in_RDI + lVar1 + 0x198);
              *(undefined4 *)((long)in_RDI + 0x5c) = *(undefined4 *)((long)in_RDI + lVar1 + 0x19c);
              *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)((long)in_RDI + lVar1 + 0x1a0);
              in_RDI[0xd] = *(long *)((long)in_RDI + lVar1 + 0x1a8);
            }
          }
          else {
            create_group_ops(in_stack_00000608,in_stack_00000600);
          }
        }
        if ((*in_RSI & 1) != 0) {
          lVar1 = *(long *)(*in_RDI + -0x18);
          puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x168);
          if (*(long *)((long)in_RDI + lVar1 + 0x170) != 0) {
            piVar2 = *(int **)((long)in_RDI + lVar1 + 0x170);
            LOCK();
            iVar10 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (iVar10 == 1) {
              if (*(long *)((long)in_RDI + lVar1 + 0x188) == 0) {
                if ((void *)*puVar7 != (void *)0x0) {
                  free((void *)*puVar7);
                }
              }
              else {
                plVar6 = *(long **)((long)in_RDI + lVar1 + 0x188);
                (**(code **)(*plVar6 + 0x18))(plVar6,*puVar7);
              }
            }
          }
          *puVar7 = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x178) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x180) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 400) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x194) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x198) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x19c) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x1a0) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x1a8) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x170) = 0;
        }
        local_124 = 0;
      }
      else {
        create_group_ops(in_stack_00000608,in_stack_00000600);
        if ((*in_RSI & 1) != 0) {
          lVar1 = *(long *)(*in_RDI + -0x18);
          puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x168);
          if (*(long *)((long)in_RDI + lVar1 + 0x170) != 0) {
            piVar2 = *(int **)((long)in_RDI + lVar1 + 0x170);
            LOCK();
            iVar10 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (iVar10 == 1) {
              if (*(long *)((long)in_RDI + lVar1 + 0x188) == 0) {
                if ((void *)*puVar7 != (void *)0x0) {
                  free((void *)*puVar7);
                }
              }
              else {
                plVar6 = *(long **)((long)in_RDI + lVar1 + 0x188);
                (**(code **)(*plVar6 + 0x18))(plVar6,*puVar7);
              }
            }
          }
          *puVar7 = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x178) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x180) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 400) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x194) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x198) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x19c) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x1a0) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x1a8) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x170) = 0;
        }
        local_124 = 0;
      }
    }
    else {
      local_124 = create_pipeline_int8_x86(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    }
  }
  else {
    local_124 = 0;
  }
  return local_124;
}

Assistant:

int ConvolutionDepthWise_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}